

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 GenStateCompileFunc(jx9_gen_state *pGen,SyString *pName,sxi32 iFlags,jx9_vm_func **ppFunc)

{
  jx9_vm *pjVar1;
  uint uVar2;
  sxi32 sVar3;
  SySet *pSet;
  SyMemBackend *pSVar4;
  GenBlock *pGVar5;
  SyHashEntry *pSVar6;
  ulong uVar7;
  SySet *pSVar8;
  SySet *pSVar9;
  char *zFormat;
  int iVar10;
  sxu32 sVar11;
  undefined4 in_register_00000014;
  GenBlock **ppBlock;
  int iVar12;
  SyToken *pSVar13;
  SyToken *pSVar14;
  SyToken *pSVar15;
  SyHash *pHash;
  undefined4 local_cc;
  SySet *local_c8;
  SySet *local_c0;
  undefined8 *local_b8;
  SyToken *pEnd;
  GenBlock *local_a8;
  uint local_a0;
  SySet local_98;
  int local_70;
  SyToken *local_68;
  SyToken *pSStack_60;
  SyBlob sSig;
  
  sVar11 = pGen->pIn->nLine;
  pSVar13 = pGen->pIn + 1;
  pGen->pIn = pSVar13;
  jx9DelimitNestedTokens(pSVar13,pGen->pEnd,0x200,0x400,&pEnd);
  pSVar13 = pEnd;
  if (pEnd < pGen->pEnd) {
    pSet = (SySet *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator,0xb0);
    if ((pSet != (SySet *)0x0) &&
       (pSVar4 = (SyMemBackend *)
                 SyMemBackendStrDup(&pGen->pVm->sAllocator,pName->zString,pName->nByte),
       pSVar4 != (SyMemBackend *)0x0)) {
      pjVar1 = pGen->pVm;
      uVar2 = pName->nByte;
      local_b8 = (undefined8 *)CONCAT44(in_register_00000014,iFlags);
      SyZero(pSet,0xb0);
      pSet->nUsed = 0;
      pSet->nSize = 0;
      pSet->eSize = 0x40;
      pSet->nCursor = 0;
      pSet->pAllocator = &pjVar1->sAllocator;
      pSet->pBase = (void *)0x0;
      pSet->pUserData = (void *)0x0;
      pSet[1].nUsed = 0;
      pSet[1].nSize = 0;
      pSet[1].eSize = 0x40;
      pSet[1].nCursor = 0;
      pSet[1].pAllocator = &pjVar1->sAllocator;
      pSet[1].pBase = (void *)0x0;
      pSet[1].pUserData = (void *)0x0;
      pSet[2].pUserData = (void *)0x0;
      pSet[3].pAllocator = (SyMemBackend *)0x18;
      *(jx9_vm **)&pSet[2].nUsed = pjVar1;
      pSet[2].eSize = 0;
      pSet[2].nCursor = 0;
      local_c0 = (SySet *)&pSet[2].nUsed;
      pSet[3].pBase = (void *)0x0;
      SySetAlloc(local_c0,0x10);
      pSet[3].nUsed = 0;
      pSet[4].pAllocator = (SyMemBackend *)0x0;
      pSet[2].pAllocator = pSVar4;
      *(uint *)&pSet[2].pBase = uVar2;
      pSVar14 = pGen->pIn;
      if (pSVar14 < pSVar13) {
        sSig.pAllocator = &pGen->pVm->sAllocator;
        sSig.pBlob = (void *)0x0;
        sSig.nByte = 0;
        sSig.mByte = 0;
        sSig.nFlags = 0;
        while (pSVar14 < pSVar13) {
          SyZero(&local_a8,0x40);
          local_98.pAllocator = &pGen->pVm->sAllocator;
          local_98.nUsed = 0;
          local_98.nSize = 0;
          local_98.eSize = 0x18;
          local_98.nCursor = 0;
          local_98.pBase = (void *)0x0;
          local_98.pUserData = (void *)0x0;
          if ((pSVar14->nType & 0xc) != 0) {
            if ((pSVar14->nType & 4) != 0) {
              if ((short)pSVar14->pUserData < 0) {
                local_70 = 8;
              }
              else {
                uVar2 = (uint)pSVar14->pUserData;
                if ((uVar2 >> 0x10 & 1) == 0) {
                  if ((uVar2 >> 0x12 & 1) == 0) {
                    if ((uVar2 >> 0x11 & 1) == 0) {
                      jx9GenCompileError(pGen,2,pGen->pIn->nLine,
                                         "Invalid argument type \'%z\', Automatic cast will not be performed"
                                         ,pSVar14);
                    }
                    else {
                      local_70 = 4;
                    }
                  }
                  else {
                    local_70 = 1;
                  }
                }
                else {
                  local_70 = 2;
                }
              }
            }
            pSVar14 = pSVar14 + 1;
          }
          if (pSVar13 <= pSVar14) {
            sVar11 = pGen->pIn->nLine;
            zFormat = "Missing argument name";
LAB_0012488e:
            iVar10 = jx9GenCompileError(pGen,1,sVar11,zFormat);
LAB_0012489b:
            if (iVar10 == -10) {
              return -10;
            }
            goto LAB_001248a0;
          }
          if ((((pSVar14->nType & 0x10) == 0) || (pSVar13 <= pSVar14 + 1)) ||
             ((pSVar14[1].nType & 0xc) == 0)) {
            sVar11 = pGen->pIn->nLine;
            zFormat = "Invalid argument name";
            goto LAB_0012488e;
          }
          pGVar5 = (GenBlock *)
                   SyMemBackendStrDup(&pGen->pVm->sAllocator,pSVar14[1].sData.zString,
                                      pSVar14[1].sData.nByte);
          if (pGVar5 == (GenBlock *)0x0) goto LAB_001248d4;
          local_a0 = pSVar14[1].sData.nByte;
          pSVar15 = pSVar14 + 2;
          local_a8 = pGVar5;
          if (pSVar15 < pSVar13) {
            if ((pSVar14[2].nType & 0x400000) != 0) {
              uVar7 = 0x60;
              for (iVar10 = 0;
                  (pSVar15 = (SyToken *)((long)&(pSVar14->sData).zString + uVar7), pSVar15 < pSVar13
                  && ((uVar2 = *(uint *)((long)&pSVar14->nType + uVar7), (uVar2 >> 0x11 & 1) == 0 ||
                      (0 < iVar10)))); iVar10 = iVar10 + iVar12) {
                iVar12 = -(uint)((uVar2 & 0x1480) != 0);
                if ((uVar2 & 0xa40) != 0) {
                  iVar12 = 1;
                }
                uVar7 = uVar7 + 0x20;
              }
              if (uVar7 < 0x61) {
                sVar11 = pSVar14[3].nLine;
                zFormat = "Missing argument default value";
                goto LAB_0012488e;
              }
              local_c8 = pGen->pVm->pByteContainer;
              pGen->pVm->pByteContainer = &local_98;
              local_68 = pGen->pIn;
              pSStack_60 = pGen->pEnd;
              pGen->pIn = pSVar14 + 3;
              pGen->pEnd = pSVar15;
              sVar3 = jx9CompileExpr(pGen,0,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
              jx9VmEmitInstr(pGen->pVm,1,(uint)(sVar3 != -3),0,(void *)0x0,(sxu32 *)0x0);
              pSVar8 = &pGen->pVm->aByteCode;
              if (local_c8 != (SySet *)0x0) {
                pSVar8 = local_c8;
              }
              pGen->pVm->pByteContainer = pSVar8;
              pGen->pIn = local_68;
              pGen->pEnd = pSStack_60;
              if (sVar3 == -10) {
                return -10;
              }
            }
            if ((pSVar13 <= pSVar15) || ((pSVar15->nType & 0x20000) != 0)) {
              pSVar15 = pSVar15 + 1;
              goto LAB_00124787;
            }
            iVar10 = jx9GenCompileError(pGen,1,pSVar15->nLine,"Unexpected token \'%z\'",pSVar15);
            goto LAB_0012489b;
          }
LAB_00124787:
          pSVar14 = pSVar15;
          if (local_70 != 0) {
            local_cc = 0x6e;
            switch(local_70) {
            case 1:
              local_cc = 0x73;
              break;
            case 2:
              local_cc = 0x69;
              break;
            case 3:
            case 5:
            case 6:
            case 7:
              break;
            case 4:
              local_cc = 0x66;
              break;
            case 8:
              local_cc = 0x62;
              break;
            default:
              if (local_70 == 0x40) {
                local_cc = 0x68;
              }
            }
            SyBlobAppend(&sSig,&local_cc,1);
          }
          SySetPut(pSet,&local_a8);
        }
        if (sSig.nByte != 0) {
          *(void **)&pSet[3].eSize = sSig.pBlob;
          *(sxu32 *)&pSet[3].pUserData = sSig.nByte;
        }
      }
LAB_001248a0:
      pGen->pIn = pEnd + 1;
      sVar3 = GenStateEnterBlock(pGen,10,pGen->pVm->pByteContainer->nUsed,pSet,&local_a8);
      if (sVar3 == 0) {
        pSVar8 = pGen->pVm->pByteContainer;
        pGen->pVm->pByteContainer = local_c0;
        jx9CompileBlock(pGen);
        ppBlock = (GenBlock **)0x1;
        jx9VmEmitInstr(pGen->pVm,1,0,0,(void *)0x0,(sxu32 *)0x0);
        pSVar9 = &pGen->pVm->aByteCode;
        if (pSVar8 != (SySet *)0x0) {
          pSVar9 = pSVar8;
        }
        pGen->pVm->pByteContainer = pSVar9;
        GenStateLeaveBlock(pGen,ppBlock);
        if (local_b8 != (undefined8 *)0x0) {
          *local_b8 = pSet;
        }
        pHash = &pGen->pVm->hFunction;
        pSVar6 = SyHashGet(pHash,pSet[2].pAllocator,*(sxu32 *)&pSet[2].pBase);
        if (pSVar6 == (SyHashEntry *)0x0) {
          pSet[4].pBase = (void *)0x0;
          sVar3 = SyHashInsert(pHash,pSet[2].pAllocator,*(sxu32 *)&pSet[2].pBase,pSet);
          return sVar3;
        }
        if ((SySet *)pSVar6->pUserData != pSet) {
          pSet[4].pBase = (SySet *)pSVar6->pUserData;
          pSVar6->pUserData = pSet;
          return 0;
        }
        return 0;
      }
    }
LAB_001248d4:
    GenStateOutOfMem(pGen);
  }
  else {
    sVar3 = jx9GenCompileError(pGen,1,sVar11,"Missing \')\' after function \'%z\' signature",pName);
    if (sVar3 != -10) {
      pGen->pIn = pGen->pEnd;
      return 0;
    }
  }
  return -10;
}

Assistant:

static sxi32 GenStateCompileFunc(
	jx9_gen_state *pGen, /* Code generator state */
	SyString *pName,     /* Function name. NULL otherwise */
	sxi32 iFlags,        /* Control flags */
	jx9_vm_func **ppFunc /* OUT: function state */
	)
{
	jx9_vm_func *pFunc;
	SyToken *pEnd;
	sxu32 nLine;
	char *zName;
	sxi32 rc;
	/* Extract line number */
	nLine = pGen->pIn->nLine;
	/* Jump the left parenthesis '(' */
	pGen->pIn++;
	/* Delimit the function signature */
	jx9DelimitNestedTokens(pGen->pIn, pGen->pEnd, JX9_TK_LPAREN /* '(' */, JX9_TK_RPAREN /* ')' */, &pEnd);
	if( pEnd >= pGen->pEnd ){
		/* Syntax error */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "Missing ')' after function '%z' signature", pName);
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
		pGen->pIn = pGen->pEnd;
		return SXRET_OK;
	}
	/* Create the function state */
	pFunc = (jx9_vm_func *)SyMemBackendPoolAlloc(&pGen->pVm->sAllocator, sizeof(jx9_vm_func));
	if( pFunc == 0 ){
		goto OutOfMem;
	}
	/* function ID */
	zName = SyMemBackendStrDup(&pGen->pVm->sAllocator, pName->zString, pName->nByte);
	if( zName == 0 ){
		/* Don't worry about freeing memory, everything will be released shortly */
		goto OutOfMem;
	}
	/* Initialize the function state */
	jx9VmInitFuncState(pGen->pVm, pFunc, zName, pName->nByte, iFlags, 0);
	if( pGen->pIn < pEnd ){
		/* Collect function arguments */
		rc = GenStateCollectFuncArgs(pFunc, &(*pGen), pEnd);
		if( rc == SXERR_ABORT ){
			/* Don't worry about freeing memory, everything will be released shortly */
			return SXERR_ABORT;
		}
	}
	/* Compile function body */
	pGen->pIn = &pEnd[1];
	/* Compile the body */
	rc = GenStateCompileFuncBody(&(*pGen), pFunc);
	if( rc == SXERR_ABORT ){
		return SXERR_ABORT;
	}
	if( ppFunc ){
		*ppFunc = pFunc;
	}
	/* Finally register the function */
	rc = jx9VmInstallUserFunction(pGen->pVm, pFunc, 0);
	return rc;
	/* Fall through if something goes wrong */
OutOfMem:
	/* If the supplied memory subsystem is so sick that we are unable to allocate
	 * a tiny chunk of memory, there is no much we can do here.
	 */
	return GenStateOutOfMem(pGen);
}